

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderProgramResource.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderProgramResourceTest::deinit(GeometryShaderProgramResourceTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GeometryShaderProgramResourceTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x1680))(0);
  if (this->m_program_object_id != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_program_object_id);
  }
  if (this->m_vertex_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_vertex_shader_id);
  }
  if (this->m_geometry_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_geometry_shader_id);
  }
  if (this->m_fragment_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_fragment_shader_id);
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderProgramResourceTest::deinit()
{
	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.useProgram(0);

	/* Delete program objects and shader objects */
	if (m_program_object_id != 0)
	{
		gl.deleteProgram(m_program_object_id);
	}

	if (m_vertex_shader_id != 0)
	{
		gl.deleteShader(m_vertex_shader_id);
	}

	if (m_geometry_shader_id != 0)
	{
		gl.deleteShader(m_geometry_shader_id);
	}

	if (m_fragment_shader_id != 0)
	{
		gl.deleteShader(m_fragment_shader_id);
	}

	/* Release base class */
	TestCaseBase::deinit();
}